

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

void __thiscall
Diligent::DescriptorPoolManager::FreePool(DescriptorPoolManager *this,DescriptorPoolWrapper *Pool)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar1 == 0) {
    VulkanUtilities::VulkanLogicalDevice::ResetDescriptorPool
              ((this->m_DeviceVkImpl->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,Pool->m_VkObject,0);
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
    ::
    emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
              ((deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
                *)&this->m_Pools,Pool);
    LOCK();
    (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i =
         (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DescriptorPoolManager::FreePool(VulkanUtilities::DescriptorPoolWrapper&& Pool)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    m_DeviceVkImpl.GetLogicalDevice().ResetDescriptorPool(Pool);
    m_Pools.emplace_back(std::move(Pool));
#ifdef DILIGENT_DEVELOPMENT
    --m_AllocatedPoolCounter;
#endif
}